

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

void xmlValidateNotationCallback(void *payload,void *data,xmlChar *name)

{
  int iVar1;
  xmlValidCtxtPtr ctxt;
  xmlEntityPtr cur;
  
  if ((((payload != (void *)0x0) && (*(int *)((long)payload + 0x5c) == 3)) &&
      (*(xmlChar **)((long)payload + 0x50) != (xmlChar *)0x0)) &&
     (iVar1 = xmlValidateNotationUse
                        ((xmlValidCtxtPtr)data,*(xmlDocPtr *)((long)payload + 0x40),
                         *(xmlChar **)((long)payload + 0x50)), iVar1 != 1)) {
    *(undefined4 *)((long)data + 0x40) = 0;
  }
  return;
}

Assistant:

static void
xmlValidateNotationCallback(void *payload, void *data,
	                    const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlEntityPtr cur = (xmlEntityPtr) payload;
    xmlValidCtxtPtr ctxt = (xmlValidCtxtPtr) data;
    if (cur == NULL)
	return;
    if (cur->etype == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
	xmlChar *notation = cur->content;

	if (notation != NULL) {
	    int ret;

	    ret = xmlValidateNotationUse(ctxt, cur->doc, notation);
	    if (ret != 1) {
		ctxt->valid = 0;
	    }
	}
    }
}